

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O0

void __thiscall
TEST_PlayerHandTest_Triplet_Test::~TEST_PlayerHandTest_Triplet_Test
          (TEST_PlayerHandTest_Triplet_Test *this)

{
  TEST_PlayerHandTest_Triplet_Test *mem;
  TEST_PlayerHandTest_Triplet_Test *this_local;
  
  mem = this;
  ~TEST_PlayerHandTest_Triplet_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(PlayerHandTest, Triplet)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);
	h.add(Tile::OneOfCircles);

	h.bindTriplet({
		Tile::OneOfCircles,
		Tile::OneOfCircles,
		Tile::OneOfCircles
	});

	CHECK(!h.isClosedHand());
}